

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O1

TRef crec_ct_tv(jit_State *J,CType *d,TRef dp,TRef sp,cTValue *sval)

{
  ushort uVar1;
  CTSize CVar2;
  ulong uVar3;
  byte bVar4;
  IRRef1 IVar5;
  ushort uVar6;
  IRType IVar7;
  IRType IVar8;
  IRType IVar9;
  TRef TVar10;
  uint uVar11;
  TRef TVar12;
  CTypeID CVar13;
  CType *pCVar14;
  GCcdata *pGVar15;
  IRRef1 IVar16;
  ushort uVar17;
  ulong uVar18;
  uint uVar19;
  IRRef1 IVar20;
  CTState *pCVar21;
  uint uVar22;
  bool bVar23;
  CTSize ofs;
  double *local_40;
  CTSize local_34;
  
  pCVar21 = (CTState *)(ulong)J[-1].bpropcache[0xc].mode;
  uVar19 = sp >> 0x18 & 0x1f;
  if (uVar19 - 0xf < 5) {
    local_40 = (double *)(ulong)((sval->u64 & 0x7fffffffffffffff) != 0);
    uVar19 = 9;
LAB_0015814f:
    pCVar14 = (CType *)((long)&pCVar21->tab->info + (ulong)(uVar19 << 4));
  }
  else {
    uVar11 = sp & 0x1f000000;
    if (uVar11 == 0xe000000) {
      local_40 = (double *)(ulong)((sval->u64 & 0x7fffffffffffffff) != 0);
      uVar19 = 0xe;
      goto LAB_0015814f;
    }
    if (uVar19 - 1 < 2) {
      sp = lj_ir_kint(J,(uint)(uVar11 == 0x2000000));
      uVar19 = 3;
LAB_0015886a:
      local_40 = (double *)0x0;
      goto LAB_0015814f;
    }
    IVar16 = (IRRef1)sp;
    if (0x3ffffff < uVar11) {
      if (uVar11 == 0x4000000) {
        if ((d->info & 0xf0000000) == 0x50000000) {
          uVar19 = (sval->u32).lo;
          local_40 = (double *)0x0;
          pCVar14 = lj_ctype_getfieldq(pCVar21,d,&((GCobj *)(ulong)uVar19)->str,&local_34,
                                       (CTInfo *)0x0);
          TVar10 = lj_ir_kgc(J,(GCobj *)(ulong)uVar19,IRT_STR);
          (J->fold).ins.field_0.ot = 0x884;
          (J->fold).ins.field_0.op1 = IVar16;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
          lj_opt_fold(J);
          uVar19 = 0x11;
          if (pCVar14 != (CType *)0x0) {
            if ((pCVar14->info & 0xf0000000) == 0xb0000000) {
              local_40 = (double *)(ulong)(local_34 != 0);
              sp = lj_ir_kint(J,local_34);
              uVar19 = (uint)(ushort)pCVar14->info;
            }
            else {
              local_40 = (double *)0x0;
            }
          }
          goto LAB_0015814f;
        }
        if ((d->info & 0xfc000000) == 0x30000000) {
          lj_trace_err(J,LJ_TRERR_BADTYPE);
        }
        TVar10 = lj_ir_kint64(J,0x10);
        (J->fold).ins.field_0.ot = 0x2909;
        (J->fold).ins.field_0.op1 = IVar16;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
        sp = lj_opt_fold(J);
        uVar19 = 0x14;
      }
      else {
        if (uVar11 != 0xc000000) goto LAB_00158a10;
        if (*(char *)((ulong)(sval->u32).lo + 6) == '\x01') {
          (J->fold).ins.field_0.op1 = IVar16;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4410000c;
          TVar10 = lj_opt_fold(J);
          TVar12 = lj_ir_kint(J,1);
          (J->fold).ins.field_0.ot = 0x893;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar10;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
          lj_opt_fold(J);
          (J->fold).ins.field_0.op1 = IVar16;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4409000d;
        }
        else {
          TVar10 = lj_ir_kint64(J,0x18);
          (J->fold).ins.field_0.ot = 0x2909;
          (J->fold).ins.field_0.op1 = IVar16;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
        }
        sp = lj_opt_fold(J);
        uVar19 = 0x11;
      }
      goto LAB_0015886a;
    }
    if (uVar11 == 0) {
      local_40 = (double *)0x0;
      sp = lj_ir_kptr_(J,IR_KPTR,(void *)0x0);
      uVar19 = 0x11;
      goto LAB_0015814f;
    }
    if (uVar11 == 0x3000000) goto switchD_0015820c_caseD_3;
LAB_00158a10:
    pGVar15 = argv2cdata(J,sp,sval);
    uVar1 = pGVar15->ctypeid;
    uVar19 = (sval->u32).lo;
    if ((pCVar21->tab[uVar1].info & 0xf0000000) == 0x60000000) {
      CVar13 = lj_ctype_intern(pCVar21,uVar1 | 0x20030000,8);
      pCVar14 = pCVar21->tab + CVar13;
      IVar8 = IRT_P64;
    }
    else {
      pCVar14 = pCVar21->tab + uVar1;
      IVar8 = crec_ct2irt(pCVar21,pCVar14);
    }
    local_40 = (double *)((ulong)uVar19 + 8);
    uVar19 = pCVar14->info >> 0x1c;
    uVar1 = (ushort)IVar8;
    if (uVar19 == 2) {
      (J->fold).ins.field_0.ot = uVar1 | 0x4400;
      (J->fold).ins.field_0.op1 = IVar16;
      (J->fold).ins.field_0.op2 = 0xf;
      sp = lj_opt_fold(J);
      if ((pCVar14->info & 0xf0800000) == 0x20800000) {
        local_40 = (double *)*local_40;
        uVar3 = (ulong)(ushort)pCVar14->info;
        uVar18 = uVar3 * 0x10;
        uVar19 = pCVar21->tab[uVar3].info;
        if ((uVar19 & 0xf0000000) == 0x50000000) {
          uVar18 = (ulong)((uVar19 & 0xffff) << 4);
        }
        pCVar14 = (CType *)((long)&pCVar21->tab->info + uVar18);
        IVar8 = crec_ct2irt(pCVar21,pCVar14);
LAB_00158ca3:
        if ((pCVar14->info < 0x10000000) && (IVar8 != IRT_CDATA)) {
          (J->fold).ins.field_0.ot = (ushort)IVar8 | 0x4500;
          (J->fold).ins.field_0.op1 = (IRRef1)sp;
          (J->fold).ins.field_0.op2 = 0;
          goto LAB_00158cdd;
        }
      }
    }
    else {
      if (IVar8 - IRT_I64 < 2) {
        (J->fold).ins.field_0.ot = uVar1 | 0x4400;
        (J->fold).ins.field_0.op1 = IVar16;
        (J->fold).ins.field_0.op2 = 0x11;
      }
      else {
        if (1 < IVar8 - IRT_IGC) {
          TVar10 = lj_ir_kint64(J,8);
          (J->fold).ins.field_0.ot = 0x2909;
          (J->fold).ins.field_0.op1 = IVar16;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
          sp = lj_opt_fold(J);
          goto LAB_00158ca3;
        }
        if (uVar19 == 5) {
          pCVar14 = (CType *)((long)&pCVar21->tab->info + (ulong)((pCVar14->info & 0xffff) << 4));
        }
        (J->fold).ins.field_0.ot = uVar1 | 0x4400;
        (J->fold).ins.field_0.op1 = IVar16;
        (J->fold).ins.field_0.op2 = 0x10;
      }
LAB_00158cdd:
      sp = lj_opt_fold(J);
    }
  }
  if ((d->info & 0xf0000000) == 0x50000000) {
    d = (CType *)((long)&pCVar21->tab->info + (ulong)((d->info & 0xffff) << 4));
  }
  pCVar21 = (CTState *)(ulong)J[-1].bpropcache[0xc].mode;
  IVar7 = crec_ct2irt(pCVar21,d);
  IVar8 = crec_ct2irt(pCVar21,pCVar14);
  if ((0x3fffffff < d->info) || (uVar19 = pCVar14->info, 0x3fffffff < uVar19))
  goto switchD_0015820c_caseD_3;
  uVar11 = d->size;
  bVar4 = ((byte)(0xf436fff5fff7f021 >> ((byte)(uVar19 >> 0x18) & 0x3c)) & 0xf) +
          ((byte)(0xf436fff5fff7f021 >> ((byte)(d->info >> 0x18) & 0x3c)) & 0xf) * '\b';
  if (0x36 < bVar4) {
    if (bVar4 != 0x3f) goto switchD_0015820c_caseD_3;
switchD_0015820c_caseD_36:
    if (dp == 0) goto switchD_0015820c_caseD_3;
    TVar10 = lj_ir_kint(J,uVar11);
    crec_copy(J,dp,sp,TVar10,d);
    goto LAB_0015871e;
  }
  uVar22 = pCVar14->size;
  IVar20 = (IRRef1)sp;
  uVar17 = (ushort)IVar8;
  IVar16 = (IRRef1)dp;
  uVar1 = (ushort)IVar7;
  switch(bVar4) {
  case 0:
  case 0x2d:
  case 0x2e:
  case 0x2f:
    break;
  case 1:
  case 2:
    if (IVar8 == IRT_CDATA) goto switchD_0015820c_caseD_3;
    if (IVar8 - IRT_FLOAT < 2) {
      TVar10 = lj_ir_knum_u64(J,0);
      IVar5 = (IRRef1)TVar10;
    }
    else if (IVar8 - IRT_I64 < 2) {
      TVar10 = lj_ir_kint64(J,0);
      IVar5 = (IRRef1)TVar10;
    }
    else {
      TVar10 = lj_ir_kint(J,0);
      IVar5 = (IRRef1)TVar10;
    }
    if (local_40 == (double *)0x0) {
      bVar23 = false;
    }
    else if (local_40 == (double *)0x1) {
      bVar23 = true;
    }
    else {
      CVar2 = pCVar14->size;
      if ((pCVar14->info & 0x4000000) == 0) {
        if (CVar2 == 4) {
          bVar23 = *(float *)local_40 == 0.0;
        }
        else if (CVar2 == 2) {
          bVar23 = *(short *)local_40 == 0;
        }
        else if (CVar2 == 1) {
          bVar23 = *(char *)local_40 == '\0';
        }
        else {
          bVar23 = *local_40 == 0.0;
        }
        bVar23 = !bVar23;
      }
      else {
        if (CVar2 == 4) {
          bVar23 = *(float *)local_40 != 0.0;
        }
        else {
          bVar23 = *local_40 != 0.0;
        }
        bVar23 = (bool)(-bVar23 & 1);
      }
    }
    (J->fold).ins.field_0.ot = (ushort)bVar23 << 8 | uVar17 | 0x880;
    (J->fold).ins.field_0.op1 = IVar20;
    (J->fold).ins.field_0.op2 = IVar5;
    lj_opt_fold(J);
    sp = lj_ir_kint(J,(uint)bVar23);
    break;
  default:
    goto switchD_0015820c_caseD_3;
  case 8:
  case 9:
switchD_0015820c_caseD_8:
    if ((IVar7 == IRT_CDATA) || (IVar8 == IRT_CDATA)) goto switchD_0015820c_caseD_3;
    if ((uVar11 == 8) && ((uVar22 < 8 && ((uVar19 & 0x800000) == 0)))) {
      uVar6 = uVar1 | 0x5900;
      if (uVar22 < 4) {
        IVar8 = IRT_IGC;
      }
      uVar17 = (ushort)(IVar7 << 5) | (ushort)IVar8 | 0x800;
      goto LAB_00158652;
    }
    if ((7 < uVar11) || (uVar22 != 8)) {
      if (IVar8 == IRT_IGC) {
        sp = lj_opt_narrow_toint(J,sp);
      }
      break;
    }
    IVar9 = IRT_IGC;
    if (3 < uVar11) {
      IVar9 = IVar7;
    }
    uVar17 = (ushort)IVar8 | (ushort)(IVar9 << 5);
    (J->fold).ins.field_0.ot = (ushort)IVar9 | 0x5900;
    goto LAB_001586d5;
  case 0xb:
    (J->fold).ins.field_0.ot = uVar17 | 0x4500;
    (J->fold).ins.field_0.op1 = IVar20;
    (J->fold).ins.field_0.op2 = 0;
    sp = lj_opt_fold(J);
  case 10:
    if ((IVar7 == IRT_CDATA) || (IVar8 == IRT_CDATA)) {
switchD_0015820c_caseD_3:
      lj_trace_err(J,LJ_TRERR_NYICONV);
    }
    IVar8 = IRT_IGC;
    if (3 < uVar11) {
      IVar8 = IVar7;
    }
    uVar6 = (ushort)IVar8;
    uVar17 = (ushort)(IVar8 << 5) | uVar17 | 0x1000;
LAB_0015860e:
    (J->fold).ins.field_0.ot = uVar6 | 0x5900;
    (J->fold).ins.field_0.op1 = (IRRef1)sp;
    (J->fold).ins.field_0.op2 = uVar17;
LAB_001586e4:
    sp = lj_opt_fold(J);
    break;
  case 0xd:
  case 0xe:
    if ((uVar11 & 8) == 0) {
      IVar8 = IRT_U64;
      uVar19 = 0x800000;
      uVar22 = 8;
      goto switchD_0015820c_caseD_8;
    }
    IVar8 = IRT_IGC;
    if (3 < uVar11) {
      IVar8 = IVar7;
    }
    uVar6 = (ushort)IVar8;
    uVar17 = (ushort)(IVar8 << 5) | 9;
    goto LAB_0015860e;
  case 0x10:
  case 0x11:
    goto switchD_0015820c_caseD_10;
  case 0x12:
    goto switchD_0015820c_caseD_12;
  case 0x13:
    (J->fold).ins.field_0.ot = uVar17 | 0x4500;
    (J->fold).ins.field_0.op1 = IVar20;
    (J->fold).ins.field_0.op2 = 0;
    sp = lj_opt_fold(J);
switchD_0015820c_caseD_12:
    if ((IVar7 == IRT_CDATA) || (IVar8 == IRT_CDATA)) goto switchD_0015820c_caseD_3;
    if (IVar7 == IVar8) break;
    uVar17 = uVar17 | (ushort)(IVar7 << 5);
    (J->fold).ins.field_0.ot = uVar1 | 0x5900;
LAB_001586d5:
    (J->fold).ins.field_0.op1 = (IRRef1)sp;
    (J->fold).ins.field_0.op2 = uVar17;
    goto LAB_001586e4;
  case 0x19:
  case 0x1a:
    TVar10 = lj_ir_kint64(J,(ulong)(uVar11 >> 1));
    (J->fold).ins.field_0.ot = 0x2909;
    (J->fold).ins.field_0.op1 = IVar16;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
    TVar10 = lj_opt_fold(J);
    TVar12 = lj_ir_knum_u64(J,0);
    (J->fold).ins.field_0.ot = uVar1 | 0x4c00;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar10;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
    lj_opt_fold(J);
    if ((uVar19 >> 0x1a & 1) != 0) goto switchD_0015820c_caseD_12;
switchD_0015820c_caseD_10:
    if ((IVar7 == IRT_CDATA) || (IVar8 == IRT_CDATA)) goto switchD_0015820c_caseD_3;
    uVar6 = uVar1 | 0x5900;
    if (uVar22 < 4) {
      IVar8 = IRT_IGC;
    }
    uVar17 = (ushort)(IVar7 << 5) | (ushort)IVar8;
LAB_00158652:
    (J->fold).ins.field_0.ot = uVar6;
    (J->fold).ins.field_0.op1 = IVar20;
    (J->fold).ins.field_0.op2 = uVar17;
    goto LAB_001586e4;
  case 0x1b:
    if ((IVar7 == IRT_CDATA) || (IVar8 == IRT_CDATA)) goto switchD_0015820c_caseD_3;
    (J->fold).ins.field_0.ot = uVar17 | 0x4500;
    (J->fold).ins.field_0.op1 = IVar20;
    (J->fold).ins.field_0.op2 = 0;
    TVar10 = lj_opt_fold(J);
    IVar5 = (IRRef1)TVar10;
    TVar10 = lj_ir_kint64(J,(ulong)(uVar22 >> 1));
    (J->fold).ins.field_0.ot = 0x2909;
    (J->fold).ins.field_0.op1 = IVar20;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
    TVar10 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = uVar17 | 0x4500;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar10;
    (J->fold).ins.field_0.op2 = 0;
    TVar10 = lj_opt_fold(J);
    IVar20 = (IRRef1)TVar10;
    if (IVar7 != IVar8) {
      uVar17 = uVar17 | (ushort)(IVar7 << 5);
      (J->fold).ins.field_0.ot = uVar1 | 0x5900;
      (J->fold).ins.field_0.op1 = IVar5;
      (J->fold).ins.field_0.op2 = uVar17;
      TVar10 = lj_opt_fold(J);
      IVar5 = (IRRef1)TVar10;
      (J->fold).ins.field_0.ot = uVar1 | 0x5900;
      (J->fold).ins.field_0.op1 = IVar20;
      (J->fold).ins.field_0.op2 = uVar17;
      TVar10 = lj_opt_fold(J);
      IVar20 = (IRRef1)TVar10;
    }
    (J->fold).ins.field_0.ot = uVar1 | 0x4c00;
    (J->fold).ins.field_0.op1 = IVar16;
    (J->fold).ins.field_0.op2 = IVar5;
    lj_opt_fold(J);
    TVar10 = lj_ir_kint64(J,(ulong)(uVar11 >> 1));
    (J->fold).ins.field_0.ot = 0x2909;
    (J->fold).ins.field_0.op1 = IVar16;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
    TVar10 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = uVar1 | 0x4c00;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar10;
    (J->fold).ins.field_0.op2 = IVar20;
    goto LAB_00158719;
  case 0x29:
    if (IVar8 == IRT_CDATA) goto switchD_0015820c_caseD_3;
    break;
  case 0x2a:
    if (IVar8 == IRT_CDATA) goto switchD_0015820c_caseD_3;
    uVar6 = uVar11 == 8 | 0x5914;
    uVar17 = (ushort)(uVar11 == 8) << 5 | uVar17 | 0x1280;
    goto LAB_00158652;
  case 0x36:
    goto switchD_0015820c_caseD_36;
  }
  if (dp != 0) {
    (J->fold).ins.field_0.ot = uVar1 | 0x4c00;
    (J->fold).ins.field_0.op1 = IVar16;
    (J->fold).ins.field_0.op2 = (IRRef1)sp;
LAB_00158719:
    lj_opt_fold(J);
LAB_0015871e:
    sp = 0;
  }
  return sp;
}

Assistant:

static TRef crec_ct_tv(jit_State *J, CType *d, TRef dp, TRef sp, cTValue *sval)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CTypeID sid = CTID_P_VOID;
  void *svisnz = 0;
  CType *s;
  if (LJ_LIKELY(tref_isinteger(sp))) {
    sid = CTID_INT32;
    svisnz = (void *)(intptr_t)(tvisint(sval)?(intV(sval)!=0):!tviszero(sval));
  } else if (tref_isnum(sp)) {
    sid = CTID_DOUBLE;
    svisnz = (void *)(intptr_t)(tvisint(sval)?(intV(sval)!=0):!tviszero(sval));
  } else if (tref_isbool(sp)) {
    sp = lj_ir_kint(J, tref_istrue(sp) ? 1 : 0);
    sid = CTID_BOOL;
  } else if (tref_isnil(sp)) {
    sp = lj_ir_kptr(J, NULL);
  } else if (tref_isudata(sp)) {
    GCudata *ud = udataV(sval);
    if (ud->udtype == UDTYPE_IO_FILE) {
      TRef tr = emitir(IRT(IR_FLOAD, IRT_U8), sp, IRFL_UDATA_UDTYPE);
      emitir(IRTGI(IR_EQ), tr, lj_ir_kint(J, UDTYPE_IO_FILE));
      sp = emitir(IRT(IR_FLOAD, IRT_PTR), sp, IRFL_UDATA_FILE);
    } else {
      sp = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, sizeof(GCudata)));
    }
  } else if (tref_isstr(sp)) {
    if (ctype_isenum(d->info)) {  /* Match string against enum constant. */
      GCstr *str = strV(sval);
      CTSize ofs;
      CType *cct = lj_ctype_getfield(cts, d, str, &ofs);
      /* Specialize to the name of the enum constant. */
      emitir(IRTG(IR_EQ, IRT_STR), sp, lj_ir_kstr(J, str));
      if (cct && ctype_isconstval(cct->info)) {
	lj_assertJ(ctype_child(cts, cct)->size == 4,
		   "only 32 bit const supported");  /* NYI */
	svisnz = (void *)(intptr_t)(ofs != 0);
	sp = lj_ir_kint(J, (int32_t)ofs);
	sid = ctype_cid(cct->info);
      }  /* else: interpreter will throw. */
    } else if (ctype_isrefarray(d->info)) {  /* Copy string to array. */
      lj_trace_err(J, LJ_TRERR_BADTYPE);  /* NYI */
    } else {  /* Otherwise pass the string data as a const char[]. */
      /* Don't use STRREF. It folds with SNEW, which loses the trailing NUL. */
      sp = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, sizeof(GCstr)));
      sid = CTID_A_CCHAR;
    }
  } else if (tref_islightud(sp)) {
#if LJ_64
    lj_trace_err(J, LJ_TRERR_NYICONV);
#endif
  } else {  /* NYI: tref_istab(sp). */
    IRType t;
    sid = argv2cdata(J, sp, sval)->ctypeid;
    s = ctype_raw(cts, sid);
    svisnz = cdataptr(cdataV(sval));
    if (ctype_isfunc(s->info)) {
      sid = lj_ctype_intern(cts, CTINFO(CT_PTR, CTALIGN_PTR|sid), CTSIZE_PTR);
      s = ctype_get(cts, sid);
      t = IRT_PTR;
    } else {
      t = crec_ct2irt(cts, s);
    }
    if (ctype_isptr(s->info)) {
      sp = emitir(IRT(IR_FLOAD, t), sp, IRFL_CDATA_PTR);
      if (ctype_isref(s->info)) {
	svisnz = *(void **)svisnz;
	s = ctype_rawchild(cts, s);
	if (ctype_isenum(s->info)) s = ctype_child(cts, s);
	t = crec_ct2irt(cts, s);
      } else {
	goto doconv;
      }
    } else if (t == IRT_I64 || t == IRT_U64) {
      sp = emitir(IRT(IR_FLOAD, t), sp, IRFL_CDATA_INT64);
      lj_needsplit(J);
      goto doconv;
    } else if (t == IRT_INT || t == IRT_U32) {
      if (ctype_isenum(s->info)) s = ctype_child(cts, s);
      sp = emitir(IRT(IR_FLOAD, t), sp, IRFL_CDATA_INT);
      goto doconv;
    } else {
      sp = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, sizeof(GCcdata)));
    }
    if (ctype_isnum(s->info) && t != IRT_CDATA)
      sp = emitir(IRT(IR_XLOAD, t), sp, 0);  /* Load number value. */
    goto doconv;
  }
  s = ctype_get(cts, sid);
doconv:
  if (ctype_isenum(d->info)) d = ctype_child(cts, d);
  return crec_ct_ct(J, d, s, dp, sp, svisnz);
}